

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeId.hpp
# Opt level: O2

long ableton::link::NodeId::random(void)

{
  uint uVar1;
  anon_class_16_2_625aa075 __gen;
  NodeId nodeId;
  uniform_int_distribution<unsigned_int> dist;
  random_device rd;
  mt19937 gen;
  long local_2728;
  param_type local_2720;
  random_device local_2718;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1390;
  
  std::random_device::random_device(&local_2718);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1390,(ulong)uVar1);
  local_2720._M_a = 0x21;
  local_2720._M_b = 0x7e;
  __gen.gen = &local_1390;
  __gen.dist = (uniform_int_distribution<unsigned_int> *)&local_2720;
  std::generate<unsigned_char*,ableton::link::NodeId::random()::_lambda()_1_>
            ((uchar *)&local_2728,(uchar *)&local_2720,__gen);
  std::random_device::~random_device(&local_2718);
  return local_2728;
}

Assistant:

static NodeId random()
  {
    using namespace std;

    random_device rd;
    mt19937 gen(rd());
    // uint8_t not standardized for this type - use unsigned
    uniform_int_distribution<unsigned> dist(33, 126); // printable ascii chars

    NodeId nodeId;
    generate(
      nodeId.begin(), nodeId.end(), [&] { return static_cast<uint8_t>(dist(gen)); });
    return nodeId;
  }